

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O2

void google::protobuf::compiler::php::anon_unknown_2::GenerateCMessage
               (Descriptor *message,Printer *printer)

{
  string *psVar1;
  byte bVar2;
  FileDescriptor *file;
  int i;
  long lVar3;
  char *pcVar4;
  int i_4;
  long lVar5;
  allocator local_ea;
  allocator local_e9;
  string c_name;
  string php_name;
  undefined1 local_a8 [16];
  _Rb_tree_node_base local_98;
  size_t local_78;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)&c_name,(string *)(*(long *)(message + 8) + 0x20));
  std::__cxx11::string::string((string *)&php_name,".",(allocator *)&local_50);
  std::__cxx11::string::string((string *)&local_70,"_",&local_ea);
  StringReplace((string *)local_a8,&c_name,&php_name,&local_70,true);
  std::__cxx11::string::operator=((string *)&c_name,(string *)local_a8);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&php_name);
  local_98._M_left = &local_98;
  local_98._0_8_ = 0;
  local_98._M_parent = (_Base_ptr)0x0;
  local_a8._0_8_ = (pointer)0x0;
  local_a8._8_8_ = 0;
  local_78 = 0;
  local_98._M_right = local_98._M_left;
  FullClassName<google::protobuf::Descriptor>(&php_name,message,(Options *)local_a8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_a8 + 8));
  std::__cxx11::string::string((string *)&local_70,"\\",&local_ea);
  std::__cxx11::string::string((string *)&local_50,"\\\\",&local_e9);
  StringReplace((string *)local_a8,&php_name,&local_70,&local_50,true);
  std::__cxx11::string::operator=((string *)&php_name,(string *)local_a8);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  (anonymous_namespace)::FilenameCName_abi_cxx11_
            ((string *)local_a8,*(_anonymous_namespace_ **)(message + 0x10),file);
  io::Printer::Print<char[12],std::__cxx11::string,char[7],std::__cxx11::string>
            (printer,
             "/* $c_name$ */\n\nzend_class_entry* $c_name$_ce;\n\nstatic PHP_METHOD($c_name$, __construct) {\n  $file_c_name$_AddDescriptor();\n  zim_Message___construct(INTERNAL_FUNCTION_PARAM_PASSTHRU);\n}\n\n"
             ,(char (*) [12])"file_c_name",(string *)local_a8,(char (*) [7])0x3dcf9c,&c_name);
  std::__cxx11::string::~string((string *)local_a8);
  lVar5 = 8;
  for (lVar3 = 0; lVar3 < *(int *)(message + 4); lVar3 = lVar3 + 1) {
    psVar1 = *(string **)(*(long *)(message + 0x28) + lVar5);
    UnderscoresToCamelCase((string *)local_a8,psVar1,true);
    io::Printer::
    Print<char[7],std::__cxx11::string,char[5],std::__cxx11::string,char[11],std::__cxx11::string>
              (printer,
               "static PHP_METHOD($c_name$, get$camel_name$) {\n  Message* intern = (Message*)Z_OBJ_P(getThis());\n  const upb_fielddef *f = upb_msgdef_ntofz(intern->desc->msgdef,\n                                           \"$name$\");\n  zval ret;\n  Message_get(intern, f, &ret);\n  RETURN_COPY_VALUE(&ret);\n}\n\nstatic PHP_METHOD($c_name$, set$camel_name$) {\n  Message* intern = (Message*)Z_OBJ_P(getThis());\n  const upb_fielddef *f = upb_msgdef_ntofz(intern->desc->msgdef,\n                                           \"$name$\");\n  zval *val;\n  if (zend_parse_parameters(ZEND_NUM_ARGS(), \"z\", &val)\n      == FAILURE) {\n    return;\n  }\n  Message_set(intern, f, val);\n  RETURN_COPY(getThis());\n}\n\n"
               ,(char (*) [7])0x3dcf9c,&c_name,(char (*) [5])0x3de831,psVar1,
               (char (*) [11])"camel_name",(string *)local_a8);
    std::__cxx11::string::~string((string *)local_a8);
    lVar5 = lVar5 + 0x48;
  }
  lVar5 = 8;
  for (lVar3 = 0; lVar3 < *(int *)(message + 0x6c); lVar3 = lVar3 + 1) {
    psVar1 = *(string **)(*(long *)(message + 0x30) + lVar5);
    UnderscoresToCamelCase((string *)local_a8,psVar1,true);
    io::Printer::
    Print<char[7],std::__cxx11::string,char[5],std::__cxx11::string,char[11],std::__cxx11::string>
              (printer,
               "static PHP_METHOD($c_name$, get$camel_name$) {\n  Message* intern = (Message*)Z_OBJ_P(getThis());\n  const upb_oneofdef *oneof = upb_msgdef_ntooz(intern->desc->msgdef,\n                                              \"$name$\");\n  const upb_fielddef *field = upb_msg_whichoneof(intern->msg, oneof);\n  RETURN_STRING(field ? upb_fielddef_name(field) : \"\");\n}\n"
               ,(char (*) [7])0x3dcf9c,&c_name,(char (*) [5])0x3de831,psVar1,
               (char (*) [11])"camel_name",(string *)local_a8);
    std::__cxx11::string::~string((string *)local_a8);
    lVar5 = lVar5 + 0x28;
  }
  bVar2 = (byte)message[1] >> 2 & 0x1f;
  if (bVar2 == 10) {
    pcVar4 = 
    "ZEND_BEGIN_ARG_INFO_EX(arginfo_is, 0, 0, 1)\n  ZEND_ARG_INFO(0, proto)\nZEND_END_ARG_INFO()\n\n"
    ;
LAB_002b9b2c:
    io::Printer::Print<>(printer,pcVar4);
  }
  else if (bVar2 == 0xd) {
    pcVar4 = 
    "ZEND_BEGIN_ARG_INFO_EX(arginfo_timestamp_fromdatetime, 0, 0, 1)\n  ZEND_ARG_INFO(0, datetime)\nZEND_END_ARG_INFO()\n\n"
    ;
    goto LAB_002b9b2c;
  }
  io::Printer::Print<char[7],std::__cxx11::string>
            (printer,
             "static zend_function_entry $c_name$_phpmethods[] = {\n  PHP_ME($c_name$, __construct, arginfo_construct, ZEND_ACC_PUBLIC)\n"
             ,(char (*) [7])0x3dcf9c,&c_name);
  lVar5 = 8;
  for (lVar3 = 0; lVar3 < *(int *)(message + 4); lVar3 = lVar3 + 1) {
    UnderscoresToCamelCase((string *)local_a8,*(string **)(*(long *)(message + 0x28) + lVar5),true);
    io::Printer::Print<char[7],std::__cxx11::string,char[11],std::__cxx11::string>
              (printer,
               "  PHP_ME($c_name$, get$camel_name$, arginfo_void, ZEND_ACC_PUBLIC)\n  PHP_ME($c_name$, set$camel_name$, arginfo_setter, ZEND_ACC_PUBLIC)\n"
               ,(char (*) [7])0x3dcf9c,&c_name,(char (*) [11])"camel_name",(string *)local_a8);
    std::__cxx11::string::~string((string *)local_a8);
    lVar5 = lVar5 + 0x48;
  }
  lVar5 = 8;
  for (lVar3 = 0; lVar3 < *(int *)(message + 0x6c); lVar3 = lVar3 + 1) {
    UnderscoresToCamelCase((string *)local_a8,*(string **)(*(long *)(message + 0x30) + lVar5),true);
    io::Printer::Print<char[7],std::__cxx11::string,char[11],std::__cxx11::string>
              (printer,"  PHP_ME($c_name$, get$camel_name$, arginfo_void, ZEND_ACC_PUBLIC)\n",
               (char (*) [7])0x3dcf9c,&c_name,(char (*) [11])"camel_name",(string *)local_a8);
    std::__cxx11::string::~string((string *)local_a8);
    lVar5 = lVar5 + 0x28;
  }
  bVar2 = (byte)message[1] >> 2 & 0x1f;
  if (bVar2 == 10) {
    pcVar4 = 
    "  PHP_ME($c_name$, is, arginfo_is, ZEND_ACC_PUBLIC)\n  PHP_ME($c_name$, pack, arginfo_setter, ZEND_ACC_PUBLIC)\n  PHP_ME($c_name$, unpack, arginfo_void, ZEND_ACC_PUBLIC)\n"
    ;
  }
  else {
    if (bVar2 != 0xd) goto LAB_002b9c48;
    pcVar4 = 
    "  PHP_ME($c_name$, fromDateTime, arginfo_timestamp_fromdatetime, ZEND_ACC_PUBLIC)\n  PHP_ME($c_name$, toDateTime, arginfo_void, ZEND_ACC_PUBLIC)\n"
    ;
  }
  io::Printer::Print<char[7],std::__cxx11::string>(printer,pcVar4,(char (*) [7])0x3dcf9c,&c_name);
LAB_002b9c48:
  io::Printer::Print<char[7],std::__cxx11::string,char[9],std::__cxx11::string>
            (printer,
             "  ZEND_FE_END\n};\n\nstatic void $c_name$_ModuleInit() {\n  zend_class_entry tmp_ce;\n\n  INIT_CLASS_ENTRY(tmp_ce, \"$php_name$\",\n                   $c_name$_phpmethods);\n\n  $c_name$_ce = zend_register_internal_class(&tmp_ce);\n  $c_name$_ce->ce_flags |= ZEND_ACC_FINAL;\n  $c_name$_ce->create_object = Message_create;\n  zend_do_inheritance($c_name$_ce, message_ce);\n}\n\n"
             ,(char (*) [7])0x3dcf9c,&c_name,(char (*) [9])"php_name",&php_name);
  lVar3 = 0;
  for (lVar5 = 0; lVar5 < *(int *)(message + 0x70); lVar5 = lVar5 + 1) {
    GenerateCMessage((Descriptor *)(*(long *)(message + 0x38) + lVar3),printer);
    lVar3 = lVar3 + 0x88;
  }
  lVar3 = 0;
  for (lVar5 = 0; lVar5 < *(int *)(message + 0x74); lVar5 = lVar5 + 1) {
    GenerateCEnum((EnumDescriptor *)(*(long *)(message + 0x40) + lVar3),printer);
    lVar3 = lVar3 + 0x48;
  }
  std::__cxx11::string::~string((string *)&php_name);
  std::__cxx11::string::~string((string *)&c_name);
  return;
}

Assistant:

void GenerateCMessage(const Descriptor* message, io::Printer* printer) {
  std::string c_name = message->full_name();
  c_name = StringReplace(c_name, ".", "_", true);
  std::string php_name = FullClassName(message, Options());
  php_name = StringReplace(php_name, "\\", "\\\\", true);
  printer->Print(
      "/* $c_name$ */\n"
      "\n"
      "zend_class_entry* $c_name$_ce;\n"
      "\n"
      "static PHP_METHOD($c_name$, __construct) {\n"
      "  $file_c_name$_AddDescriptor();\n"
      "  zim_Message___construct(INTERNAL_FUNCTION_PARAM_PASSTHRU);\n"
      "}\n"
      "\n",
      "file_c_name", FilenameCName(message->file()),
      "c_name", c_name);

  for (int i = 0; i < message->field_count(); i++) {
    auto field = message->field(i);
    printer->Print(
      "static PHP_METHOD($c_name$, get$camel_name$) {\n"
      "  Message* intern = (Message*)Z_OBJ_P(getThis());\n"
      "  const upb_fielddef *f = upb_msgdef_ntofz(intern->desc->msgdef,\n"
      "                                           \"$name$\");\n"
      "  zval ret;\n"
      "  Message_get(intern, f, &ret);\n"
      "  RETURN_COPY_VALUE(&ret);\n"
      "}\n"
      "\n"
      "static PHP_METHOD($c_name$, set$camel_name$) {\n"
      "  Message* intern = (Message*)Z_OBJ_P(getThis());\n"
      "  const upb_fielddef *f = upb_msgdef_ntofz(intern->desc->msgdef,\n"
      "                                           \"$name$\");\n"
      "  zval *val;\n"
      "  if (zend_parse_parameters(ZEND_NUM_ARGS(), \"z\", &val)\n"
      "      == FAILURE) {\n"
      "    return;\n"
      "  }\n"
      "  Message_set(intern, f, val);\n"
      "  RETURN_COPY(getThis());\n"
      "}\n"
      "\n",
      "c_name", c_name,
      "name", field->name(),
      "camel_name", UnderscoresToCamelCase(field->name(), true));
  }

  for (int i = 0; i < message->real_oneof_decl_count(); i++) {
    auto oneof = message->oneof_decl(i);
    printer->Print(
      "static PHP_METHOD($c_name$, get$camel_name$) {\n"
      "  Message* intern = (Message*)Z_OBJ_P(getThis());\n"
      "  const upb_oneofdef *oneof = upb_msgdef_ntooz(intern->desc->msgdef,\n"
      "                                              \"$name$\");\n"
      "  const upb_fielddef *field = upb_msg_whichoneof(intern->msg, oneof);\n"
      "  RETURN_STRING(field ? upb_fielddef_name(field) : \"\");\n"
      "}\n",
      "c_name", c_name,
      "name", oneof->name(),
      "camel_name", UnderscoresToCamelCase(oneof->name(), true));
  }

  switch (message->well_known_type()) {
    case Descriptor::WELLKNOWNTYPE_ANY:
      printer->Print(
          "ZEND_BEGIN_ARG_INFO_EX(arginfo_is, 0, 0, 1)\n"
          "  ZEND_ARG_INFO(0, proto)\n"
          "ZEND_END_ARG_INFO()\n"
          "\n"
      );
      break;
    case Descriptor::WELLKNOWNTYPE_TIMESTAMP:
      printer->Print(
          "ZEND_BEGIN_ARG_INFO_EX(arginfo_timestamp_fromdatetime, 0, 0, 1)\n"
          "  ZEND_ARG_INFO(0, datetime)\n"
          "ZEND_END_ARG_INFO()\n"
          "\n"
      );
      break;
    default:
      break;
  }

  printer->Print(
      "static zend_function_entry $c_name$_phpmethods[] = {\n"
      "  PHP_ME($c_name$, __construct, arginfo_construct, ZEND_ACC_PUBLIC)\n",
      "c_name", c_name);

  for (int i = 0; i < message->field_count(); i++) {
    auto field = message->field(i);
    printer->Print(
      "  PHP_ME($c_name$, get$camel_name$, arginfo_void, ZEND_ACC_PUBLIC)\n"
      "  PHP_ME($c_name$, set$camel_name$, arginfo_setter, ZEND_ACC_PUBLIC)\n",
      "c_name", c_name,
      "camel_name", UnderscoresToCamelCase(field->name(), true));
  }

  for (int i = 0; i < message->real_oneof_decl_count(); i++) {
    auto oneof = message->oneof_decl(i);
    printer->Print(
      "  PHP_ME($c_name$, get$camel_name$, arginfo_void, ZEND_ACC_PUBLIC)\n",
      "c_name", c_name,
      "camel_name", UnderscoresToCamelCase(oneof->name(), true));
  }

  // Extra hand-written functions added to the well-known types.
  switch (message->well_known_type()) {
    case Descriptor::WELLKNOWNTYPE_ANY:
      printer->Print(
        "  PHP_ME($c_name$, is, arginfo_is, ZEND_ACC_PUBLIC)\n"
        "  PHP_ME($c_name$, pack, arginfo_setter, ZEND_ACC_PUBLIC)\n"
        "  PHP_ME($c_name$, unpack, arginfo_void, ZEND_ACC_PUBLIC)\n",
        "c_name", c_name);
      break;
    case Descriptor::WELLKNOWNTYPE_TIMESTAMP:
      printer->Print(
        "  PHP_ME($c_name$, fromDateTime, arginfo_timestamp_fromdatetime, ZEND_ACC_PUBLIC)\n"
        "  PHP_ME($c_name$, toDateTime, arginfo_void, ZEND_ACC_PUBLIC)\n",
        "c_name", c_name);
      break;
    default:
      break;
  } 

  printer->Print(
      "  ZEND_FE_END\n"
      "};\n"
      "\n"
      "static void $c_name$_ModuleInit() {\n"
      "  zend_class_entry tmp_ce;\n"
      "\n"
      "  INIT_CLASS_ENTRY(tmp_ce, \"$php_name$\",\n"
      "                   $c_name$_phpmethods);\n"
      "\n"
      "  $c_name$_ce = zend_register_internal_class(&tmp_ce);\n"
      "  $c_name$_ce->ce_flags |= ZEND_ACC_FINAL;\n"
      "  $c_name$_ce->create_object = Message_create;\n"
      "  zend_do_inheritance($c_name$_ce, message_ce);\n"
      "}\n"
      "\n",
      "c_name", c_name,
      "php_name", php_name);

  for (int i = 0; i < message->nested_type_count(); i++) {
    GenerateCMessage(message->nested_type(i), printer);
  }
  for (int i = 0; i < message->enum_type_count(); i++) {
    GenerateCEnum(message->enum_type(i), printer);
  }
}